

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

bool __thiscall ON_SubDVertex::HasBoundaryVertexTopology(ON_SubDVertex *this)

{
  ushort uVar1;
  short sVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  
  uVar1 = this->m_edge_count;
  if ((((1 < uVar1) && (this->m_face_count + 1 == (uint)uVar1)) &&
      (this->m_edges != (ON_SubDEdgePtr *)0x0)) && (this->m_faces != (ON_SubDFace **)0x0)) {
    iVar3 = 0;
    bVar6 = true;
    uVar4 = 1;
    do {
      uVar5 = this->m_edges[uVar4 - 1].m_ptr & 0xfffffffffffffff8;
      if ((uVar5 == 0) ||
         (sVar2 = (short)*(undefined4 *)(uVar5 + 100), (ushort)(sVar2 - 3U) < 0xfffe)) {
        bVar7 = false;
      }
      else {
        iVar3 = iVar3 + (uint)(sVar2 == 1);
        bVar7 = true;
      }
      if (!bVar7) break;
      bVar6 = uVar4 < uVar1;
      bVar7 = uVar4 != uVar1;
      uVar4 = uVar4 + 1;
    } while (bVar7);
    bVar7 = (bool)(~bVar6 & iVar3 == 2);
    if (bVar6 != false) {
      return bVar7;
    }
    if (iVar3 == 2) {
      return bVar7;
    }
  }
  return false;
}

Assistant:

bool ON_SubDVertex::HasBoundaryVertexTopology() const
{
  if (m_edge_count >= 2 && m_edge_count == m_face_count+1 && nullptr != m_edges && nullptr != m_faces)
  {
    unsigned boundary_count = 0;
    for (unsigned short vei = 0; vei < m_edge_count; ++vei)
    {
      const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(m_edges[vei].m_ptr);
      if (nullptr == e || 0 == e->m_face_count || e->m_face_count > 2)
        return false;
      if (1 == e->m_face_count)
        ++boundary_count;
    }
    if (2 == boundary_count)
      return true;
  }    
  return false;
}